

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrcSymTable.cpp
# Opt level: O1

string * __thiscall
GrcSymbolTableEntry::FullAbbrevOmit
          (string *__return_storage_ptr__,GrcSymbolTableEntry *this,string *staOmit)

{
  pointer pcVar1;
  bool bVar2;
  int iVar3;
  Symbol pGVar4;
  string staTmp;
  string local_90;
  string local_70;
  string local_50;
  
  pcVar1 = (this->m_staFieldName)._M_dataplus._M_p;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar1,pcVar1 + (this->m_staFieldName)._M_string_length);
  Abbreviation(__return_storage_ptr__,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  pGVar4 = this->m_psymtbl->m_psymParent;
  do {
    if (pGVar4 == (Symbol)0x0) {
      return __return_storage_ptr__;
    }
    pcVar1 = (pGVar4->m_staFieldName)._M_dataplus._M_p;
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,pcVar1,pcVar1 + (pGVar4->m_staFieldName)._M_string_length);
    Abbreviation(&local_90,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    if ((local_90._M_string_length == staOmit->_M_string_length) &&
       ((local_90._M_string_length == 0 ||
        (iVar3 = bcmp(local_90._M_dataplus._M_p,(staOmit->_M_dataplus)._M_p,
                      local_90._M_string_length), iVar3 == 0)))) {
      bVar2 = false;
    }
    else {
      std::__cxx11::string::append((char *)&local_90);
      std::__cxx11::string::_M_append
                ((char *)&local_90,(ulong)(__return_storage_ptr__->_M_dataplus)._M_p);
      std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
      pGVar4 = pGVar4->m_psymtbl->m_psymParent;
      bVar2 = true;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
  } while (bVar2);
  return __return_storage_ptr__;
}

Assistant:

std::string GrcSymbolTableEntry::FullAbbrevOmit(std::string staOmit)
{
	std::string staRet = Abbreviation(m_staFieldName);
	GrcSymbolTableEntry * psymCurr = m_psymtbl->m_psymParent;
	while (psymCurr)
	{
		std::string staTmp = Abbreviation(psymCurr->m_staFieldName);
		if (staTmp == staOmit)
			break;
		staTmp += ".";
		staTmp += staRet;
		staRet = staTmp;
		psymCurr = psymCurr->m_psymtbl->m_psymParent;
	}
	return staRet;
}